

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_msmblur.h
# Opt level: O1

void __thiscall
embree::avx::BVHBuilderMSMBlur::
BuilderT<embree::NodeRefPtr<4>,_embree::avx::RecalculatePrimRef<embree::InstanceArray>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Create,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Set,_embree::avx::CreateMSMBlurLeaf<4,_embree::InstanceArray,_embree::InstanceArrayPrimitive>,_embree::Scene::BuildProgressMonitorInterface>
::BuilderT(BuilderT<embree::NodeRefPtr<4>,_embree::avx::RecalculatePrimRef<embree::InstanceArray>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Create,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Set,_embree::avx::CreateMSMBlurLeaf<4,_embree::InstanceArray,_embree::InstanceArrayPrimitive>,_embree::Scene::BuildProgressMonitorInterface>
           *this,MemoryMonitorInterface *device,Scene *recalculatePrimRef,FastAllocator *createAlloc
          ,BVH *param_5,long param_6,size_t *param_7)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  undefined8 *puVar8;
  undefined1 *local_40;
  long local_38;
  undefined1 local_30 [16];
  
  sVar1 = *param_7;
  sVar2 = param_7[1];
  sVar3 = param_7[2];
  sVar4 = param_7[3];
  sVar5 = param_7[5];
  sVar6 = param_7[6];
  sVar7 = param_7[7];
  (this->cfg).maxLeafSize = param_7[4];
  (this->cfg).travCost = (float)(int)sVar5;
  (this->cfg).intCost = (float)(int)(sVar5 >> 0x20);
  *(size_t *)&(this->cfg).singleLeafTimeSegment = sVar6;
  (this->cfg).singleThreadThreshold = sVar7;
  (this->cfg).branchingFactor = sVar1;
  (this->cfg).maxDepth = sVar2;
  (this->cfg).logBlockSize = sVar3;
  (this->cfg).minLeafSize = sVar4;
  (this->heuristicTemporalSplit).device = device;
  (this->heuristicTemporalSplit).recalculatePrimRef.scene = recalculatePrimRef;
  (this->recalculatePrimRef).scene = recalculatePrimRef;
  (this->createAlloc).super_Create.allocator = createAlloc;
  (this->createLeaf).bvh = param_5;
  (this->progressMonitor).super_BuildProgressMonitor._vptr_BuildProgressMonitor =
       (_func_int **)&PTR_operator___02202970;
  (this->progressMonitor).scene = *(Scene **)(param_6 + 8);
  if ((this->cfg).branchingFactor < 0x11) {
    return;
  }
  puVar8 = (undefined8 *)__cxa_allocate_exception(0x30);
  local_40 = local_30;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"bvh_builder: branching factor too large","");
  *puVar8 = &PTR__rtcore_error_022018b0;
  *(undefined4 *)(puVar8 + 1) = 1;
  puVar8[2] = puVar8 + 4;
  std::__cxx11::string::_M_construct<char*>((string *)(puVar8 + 2),local_40,local_40 + local_38);
  __cxa_throw(puVar8,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
}

Assistant:

BuilderT (MemoryMonitorInterface* device,
                    const RecalculatePrimRef recalculatePrimRef,
                    const CreateAllocFunc createAlloc,
                    const CreateNodeFunc createNode,
                    const SetNodeFunc setNode,
                    const CreateLeafFunc createLeaf,
                    const ProgressMonitor progressMonitor,
                    const Settings& settings)
            : cfg(settings),
            heuristicObjectSplit(),
            heuristicTemporalSplit(device, recalculatePrimRef),
            recalculatePrimRef(recalculatePrimRef), createAlloc(createAlloc), createNode(createNode), setNode(setNode), createLeaf(createLeaf),
            progressMonitor(progressMonitor)
          {
            if (cfg.branchingFactor > MAX_BRANCHING_FACTOR)
              throw_RTCError(RTC_ERROR_UNKNOWN,"bvh_builder: branching factor too large");
          }